

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O2

int CfdAddTxPegoutOutput
              (void *handle,void *create_handle,char *asset,int64_t amount,
              int mainchain_network_type,int elements_network_type,
              char *mainchain_genesis_block_hash,char *online_pubkey,char *master_online_key,
              char *mainchain_output_descriptor,uint32_t bip32_counter,char *whitelist,
              char **mainchain_address)

{
  ConfidentialTransactionContext *this;
  bool bVar1;
  NetType elements_net_type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  allocator local_47d;
  allocator local_47c;
  allocator local_47b;
  allocator local_47a;
  allocator local_479;
  void *local_478;
  NetType local_46c;
  Privkey master_online_privkey;
  ConfidentialAssetId local_448;
  Address btc_derive_address;
  string local_2a8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_288;
  string local_270;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_250;
  string local_238;
  BlockHash local_218;
  string local_1f8;
  Amount local_1d8;
  string local_1c8;
  Address local_1a8;
  
  local_478 = handle;
  cfd::Initialize();
  std::__cxx11::string::string
            ((string *)&btc_derive_address,"TransactionData",(allocator *)&local_1a8);
  cfd::capi::CheckBuffer(create_handle,(string *)&btc_derive_address);
  std::__cxx11::string::~string((string *)&btc_derive_address);
  if (asset == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbc2;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&btc_derive_address,"asset is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&btc_derive_address,"Failed to parameter. asset is null.",
               (allocator *)&local_1a8);
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (mainchain_genesis_block_hash == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbc8;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&btc_derive_address,"mainchain_genesis_block_hash is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&btc_derive_address,
               "Failed to parameter. mainchain_genesis_block_hash is null.",(allocator *)&local_1a8)
    ;
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (online_pubkey == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbce;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&btc_derive_address,"online_pubkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&btc_derive_address,"Failed to parameter. online_pubkey is null.",
               (allocator *)&local_1a8);
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (master_online_key == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbd4;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&btc_derive_address,"master_online_key is null.")
    ;
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&btc_derive_address,"Failed to parameter. master_online_key is null.",
               (allocator *)&local_1a8);
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (mainchain_output_descriptor == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbda;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>
              ((CfdSourceLocation *)&btc_derive_address,"mainchain_output_descriptor is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&btc_derive_address,
               "Failed to parameter. mainchain_output_descriptor is null.",(allocator *)&local_1a8);
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (whitelist == (char *)0x0) {
    btc_derive_address._0_8_ =
         (long)
         "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_elements_transaction.cpp"
         + 0x56;
    btc_derive_address.witness_ver_ = 0xbe0;
    btc_derive_address.address_._M_dataplus._M_p = "CfdAddTxPegoutOutput";
    cfd::core::logger::warn<>((CfdSourceLocation *)&btc_derive_address,"whitelist is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&btc_derive_address,"Failed to parameter. whitelist is null.",
               (allocator *)&local_1a8);
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  is_bitcoin = false;
  cfd::capi::ConvertNetType(*(int *)((long)create_handle + 0x10),&is_bitcoin);
  if (*(long *)((long)create_handle + 0x18) == 0) {
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&btc_derive_address,"Invalid handle state. tx is null",
               (allocator *)&local_1a8);
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalStateError,(string *)&btc_derive_address);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (is_bitcoin != true) {
    local_46c = cfd::capi::ConvertNetType(mainchain_network_type,&is_bitcoin);
    if (is_bitcoin == false) {
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&btc_derive_address,"Invalid mainchain network type.",
                 (allocator *)&local_1a8);
      cfd::core::CfdException::CfdException
                (pCVar3,kCfdIllegalArgumentError,(string *)&btc_derive_address);
      __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    elements_net_type = cfd::capi::ConvertNetType(elements_network_type,&is_bitcoin);
    if (is_bitcoin != true) {
      cfd::core::Privkey::Privkey(&master_online_privkey);
      std::__cxx11::string::string
                ((string *)&btc_derive_address,master_online_key,(allocator *)&local_1a8);
      bVar1 = cfd::core::Privkey::HasWif((string *)&btc_derive_address,(NetType *)0x0,(bool *)0x0);
      std::__cxx11::string::~string((string *)&btc_derive_address);
      if (bVar1) {
        std::__cxx11::string::string((string *)&local_1a8,master_online_key,(allocator *)&local_448)
        ;
        cfd::core::Privkey::FromWif
                  ((Privkey *)&btc_derive_address,(string *)&local_1a8,kCustomChain,true);
      }
      else {
        std::__cxx11::string::string((string *)&local_1a8,master_online_key,(allocator *)&local_448)
        ;
        cfd::core::Privkey::Privkey
                  ((Privkey *)&btc_derive_address,(string *)&local_1a8,kMainnet,true);
      }
      cfd::core::Privkey::operator=(&master_online_privkey,(Privkey *)&btc_derive_address);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&btc_derive_address)
      ;
      std::__cxx11::string::~string((string *)&local_1a8);
      this = *(ConfidentialTransactionContext **)((long)create_handle + 0x18);
      cfd::core::Address::Address(&btc_derive_address);
      cfd::core::Amount::Amount(&local_1d8,amount);
      std::__cxx11::string::string((string *)&local_1f8,asset,&local_479);
      cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_448,&local_1f8);
      std::__cxx11::string::string((string *)&local_238,mainchain_genesis_block_hash,&local_47a);
      cfd::core::BlockHash::BlockHash(&local_218,&local_238);
      cfd::core::Address::Address(&local_1a8);
      std::__cxx11::string::string((string *)&local_270,online_pubkey,&local_47b);
      cfd::core::Pubkey::Pubkey((Pubkey *)&local_250,&local_270);
      std::__cxx11::string::string((string *)&local_1c8,mainchain_output_descriptor,&local_47c);
      std::__cxx11::string::string((string *)&local_2a8,whitelist,&local_47d);
      cfd::core::ByteData::ByteData((ByteData *)&local_288,&local_2a8);
      cfd::ConfidentialTransactionContext::AddPegoutTxOut
                (this,&local_1d8,&local_448,&local_218,&local_1a8,local_46c,(Pubkey *)&local_250,
                 &master_online_privkey,&local_1c8,bip32_counter,(ByteData *)&local_288,
                 elements_net_type,&btc_derive_address);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_288);
      std::__cxx11::string::~string((string *)&local_2a8);
      std::__cxx11::string::~string((string *)&local_1c8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      cfd::core::Address::~Address(&local_1a8);
      cfd::core::BlockHash::~BlockHash(&local_218);
      std::__cxx11::string::~string((string *)&local_238);
      cfd::core::ConfidentialAssetId::~ConfidentialAssetId(&local_448);
      std::__cxx11::string::~string((string *)&local_1f8);
      if (mainchain_address != (char **)0x0) {
        cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_1a8,&btc_derive_address);
        pcVar2 = cfd::capi::CreateString((string *)&local_1a8);
        *mainchain_address = pcVar2;
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      cfd::core::Address::~Address(&btc_derive_address);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &master_online_privkey);
      return 0;
    }
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&btc_derive_address,"Invalid network type.",(allocator *)&local_1a8);
    cfd::core::CfdException::CfdException
              (pCVar3,kCfdIllegalArgumentError,(string *)&btc_derive_address);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&btc_derive_address,"Invalid handle state. tx is bitcoin.",
             (allocator *)&local_1a8);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)&btc_derive_address);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddTxPegoutOutput(
    void* handle, void* create_handle, const char* asset, int64_t amount,
    int mainchain_network_type, int elements_network_type,
    const char* mainchain_genesis_block_hash, const char* online_pubkey,
    const char* master_online_key, const char* mainchain_output_descriptor,
    uint32_t bip32_counter, const char* whitelist, char** mainchain_address) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(create_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(create_handle);
    if (asset == nullptr) {
      warn(CFD_LOG_SOURCE, "asset is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. asset is null.");
    }
    if (mainchain_genesis_block_hash == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_genesis_block_hash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_genesis_block_hash is null.");
    }
    if (online_pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "online_pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. online_pubkey is null.");
    }
    if (master_online_key == nullptr) {
      warn(CFD_LOG_SOURCE, "master_online_key is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. master_online_key is null.");
    }
    if (mainchain_output_descriptor == nullptr) {
      warn(CFD_LOG_SOURCE, "mainchain_output_descriptor is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. mainchain_output_descriptor is null.");
    }
    if (whitelist == nullptr) {
      warn(CFD_LOG_SOURCE, "whitelist is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. whitelist is null.");
    }

    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    auto mainchain_net_type =
        ConvertNetType(mainchain_network_type, &is_bitcoin);
    if (!is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Invalid mainchain network type.");
    }
    auto elements_net_type =
        ConvertNetType(elements_network_type, &is_bitcoin);
    if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Invalid network type.");
    }
    Privkey master_online_privkey;
    if (Privkey::HasWif(master_online_key)) {
      master_online_privkey = Privkey::FromWif(master_online_key);
    } else {
      master_online_privkey = Privkey(master_online_key);
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    Address btc_derive_address;
    tx->AddPegoutTxOut(
        Amount(amount), ConfidentialAssetId(asset),
        BlockHash(mainchain_genesis_block_hash), Address(), mainchain_net_type,
        Pubkey(online_pubkey), master_online_privkey,
        mainchain_output_descriptor, bip32_counter, ByteData(whitelist),
        elements_net_type, &btc_derive_address);

    if (mainchain_address != nullptr) {
      *mainchain_address = CreateString(btc_derive_address.GetAddress());
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}